

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

UInt32 RcTree_ReverseGetPrice(UInt16 *probs,int numBitLevels,UInt32 symbol,UInt32 *ProbPrices)

{
  uint uVar1;
  UInt32 bit;
  int i;
  UInt32 m;
  UInt32 price;
  UInt32 *ProbPrices_local;
  UInt32 symbol_local;
  int numBitLevels_local;
  UInt16 *probs_local;
  
  price = 0;
  m = 1;
  symbol_local = symbol;
  for (i = numBitLevels; i != 0; i = i + -1) {
    uVar1 = symbol_local & 1;
    symbol_local = symbol_local >> 1;
    price = ProbPrices[(int)((uint)probs[m] ^ -uVar1 & 0x7ff) >> 4] + price;
    m = m << 1 | uVar1;
  }
  return price;
}

Assistant:

static UInt32 RcTree_ReverseGetPrice(const CLzmaProb *probs, int numBitLevels, UInt32 symbol, const UInt32 *ProbPrices)
{
  UInt32 price = 0;
  UInt32 m = 1;
  int i;
  for (i = numBitLevels; i != 0; i--)
  {
    UInt32 bit = symbol & 1;
    symbol >>= 1;
    price += GET_PRICEa(probs[m], bit);
    m = (m << 1) | bit;
  }
  return price;
}